

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableHeader(char *label)

{
  ImVec2 *pIVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int column_n;
  ImGuiWindow *this;
  ImGuiTable *table;
  ImVec2 IVar4;
  ImDrawList *draw_list;
  ImVec2 IVar5;
  ImGuiContext *pIVar6;
  bool bVar7;
  bool bVar8;
  ImGuiID id;
  ImU32 IVar9;
  ImGuiSortDirection sort_direction;
  char *text_end;
  ImGuiTableColumn *pIVar10;
  ImGuiTableColumn *column;
  char *text;
  uint uVar11;
  uint uVar12;
  float fVar13;
  float fVar14;
  ulong uVar15;
  float fVar16;
  ImRect IVar17;
  ImRect bb;
  bool held;
  bool hovered;
  float local_fc;
  long local_f8;
  char sort_order_suf [4];
  float local_e8;
  float local_d8;
  float fStack_d4;
  float local_b8;
  float fStack_b4;
  float local_98;
  float fStack_94;
  ImVec2 label_pos;
  ImVec2 label_size;
  ImVec2 local_60;
  undefined1 local_58 [16];
  ImRect local_40;
  
  pIVar6 = GImGui;
  this = GImGui->CurrentWindow;
  if (this->SkipItems == false) {
    table = GImGui->CurrentTable;
    column_n = table->CurrentColumn;
    column = (table->Columns).Data + column_n;
    text = "";
    if (label != (char *)0x0) {
      text = label;
    }
    text_end = FindRenderedTextEnd(text,(char *)0x0);
    IVar5 = CalcTextSize(text,text_end,true,-1.0);
    IVar4 = (this->DC).CursorPos;
    local_f8 = (long)column_n;
    label_pos = IVar4;
    label_size = IVar5;
    IVar17 = TableGetCellBgRect(table,column_n);
    local_98 = IVar5.x;
    fStack_94 = IVar5.y;
    local_b8 = IVar17.Max.x;
    fStack_b4 = IVar17.Max.y;
    fVar14 = table->RowMinHeight - (table->CellPaddingY + table->CellPaddingY);
    uVar11 = -(uint)(fVar14 <= fStack_94);
    local_58 = ZEXT416(~uVar11 & (uint)fVar14 | (uint)fStack_94 & uVar11);
    sort_order_suf[0] = '\0';
    sort_order_suf[1] = '\0';
    sort_order_suf[2] = '\0';
    sort_order_suf[3] = '\0';
    local_fc = IVar4.x;
    fVar14 = 0.0;
    if (((table->Flags & 8) == 0) || ((column->Flags & 0x100) != 0)) {
      fVar13 = 0.0;
    }
    else {
      fVar13 = (float)(int)(pIVar6->FontSize * 0.65 + (pIVar6->Style).FramePadding.x);
      if ('\0' < column->SortOrder) {
        ImFormatString(sort_order_suf,4,"%d",(ulong)((byte)column->SortOrder + 1));
        fVar14 = (pIVar6->Style).ItemInnerSpacing.x;
        IVar5 = CalcTextSize(sort_order_suf,(char *)0x0,false,-1.0);
        fVar14 = IVar5.x + fVar14;
      }
    }
    fVar16 = local_98 + local_fc + fVar14 + fVar13;
    uVar2 = column->ContentMaxXHeadersUsed;
    uVar3 = column->ContentMaxXHeadersIdeal;
    uVar11 = -(uint)(column->WorkMaxX <= (float)uVar2);
    uVar12 = -(uint)(fVar16 <= (float)uVar3);
    uVar15 = CONCAT44(~uVar12 & (uint)fVar16,~uVar11 & (uint)column->WorkMaxX) |
             CONCAT44(uVar3 & uVar12,uVar2 & uVar11);
    column->ContentMaxXHeadersUsed = (float)(int)uVar15;
    column->ContentMaxXHeadersIdeal = (float)(int)(uVar15 >> 0x20);
    if ((table->IsContextPopupOpen == true) && ((int)local_f8 == table->ContextPopupColumn)) {
      local_fc = (float)(uint)CONCAT11((char)((ushort)table->InstanceInteracted >> 8),
                                       table->InstanceInteracted == table->InstanceCurrent);
    }
    else {
      local_fc = 0.0;
    }
    id = ImGuiWindow::GetID(this,text,(char *)0x0);
    local_d8 = IVar17.Min.x;
    fStack_d4 = IVar17.Min.y;
    fVar16 = (pIVar6->Style).CellPadding.y;
    fVar16 = fVar16 + fVar16 + fStack_d4 + (float)local_58._0_4_;
    uVar11 = -(uint)(fVar16 <= fStack_b4);
    local_40.Max.y = (float)(uVar11 & (uint)fStack_b4 | ~uVar11 & (uint)fVar16);
    local_40.Min.x = local_d8;
    local_40.Min.y = fStack_d4;
    local_40.Max.x = local_b8;
    local_60.x = 0.0;
    local_60.y = (float)local_58._0_4_;
    ItemSize(&local_60,-1.0);
    bVar7 = ItemAdd(&local_40,id,(ImRect *)0x0);
    if (bVar7) {
      bVar7 = ButtonBehavior(&local_40,id,&hovered,&held,0x1000);
      if (pIVar6->ActiveId != id) {
        SetItemAllowOverlap();
      }
      if (((held | hovered | local_fc._0_1_) & 1) == 0) {
        if ((table->field_0x90 & 1) == 0) {
          IVar9 = GetColorU32(0x2a,1.0);
          TableSetBgColor(3,IVar9,table->CurrentColumn);
        }
      }
      else {
        uVar11 = 0x1a;
        if (held == false) {
          uVar11 = hovered & 1 | 0x18;
        }
        IVar9 = GetColorU32(uVar11,1.0);
        TableSetBgColor(3,IVar9,table->CurrentColumn);
        RenderNavHighlight(&local_40,id,10);
      }
      if (held == true) {
        table->HeldHeaderColumn = (ImGuiTableColumnIdx)local_f8;
        (this->DC).CursorPos.y = (pIVar6->Style).ItemSpacing.y * -0.5 + (this->DC).CursorPos.y;
        if ((((table->Flags & 2) != 0) && (bVar8 = IsMouseDragging(0,-1.0), bVar8)) &&
           (pIVar6->DragDropActive == false)) {
          table->ReorderColumn = (ImGuiTableColumnIdx)local_f8;
          table->InstanceInteracted = table->InstanceCurrent;
          fVar16 = (pIVar6->IO).MouseDelta.x;
          if ((((fVar16 < 0.0) &&
               (pIVar1 = &(pIVar6->IO).MousePos, pIVar1->x <= local_d8 && local_d8 != pIVar1->x)) &&
              (((long)column->PrevEnabledColumn != -1 &&
               ((pIVar10 = (table->Columns).Data, pIVar10 != (ImGuiTableColumn *)0x0 &&
                (pIVar10 = pIVar10 + column->PrevEnabledColumn,
                ((pIVar10->Flags | column->Flags) & 0x20U) == 0)))))) &&
             (column->IndexWithinEnabledSet < table->FreezeColumnsRequest !=
              table->FreezeColumnsRequest <= pIVar10->IndexWithinEnabledSet)) {
            table->ReorderColumnDir = -1;
          }
          if (((((0.0 < fVar16) && (local_b8 < (pIVar6->IO).MousePos.x)) &&
               ((long)column->NextEnabledColumn != -1)) &&
              ((pIVar10 = (table->Columns).Data, pIVar10 != (ImGuiTableColumn *)0x0 &&
               (pIVar10 = pIVar10 + column->NextEnabledColumn,
               ((pIVar10->Flags | column->Flags) & 0x20U) == 0)))) &&
             (column->IndexWithinEnabledSet < table->FreezeColumnsRequest !=
              table->FreezeColumnsRequest <= pIVar10->IndexWithinEnabledSet)) {
            table->ReorderColumnDir = '\x01';
          }
        }
      }
      else {
        (this->DC).CursorPos.y = (pIVar6->Style).ItemSpacing.y * -0.5 + (this->DC).CursorPos.y;
      }
      local_e8 = IVar4.y;
      fVar13 = (local_b8 - fVar13) - fVar14;
      if (((table->Flags & 8) != 0) && ((column->Flags & 0x100) == 0)) {
        if (column->SortOrder != -1) {
          fVar16 = (float)(~-(uint)(fVar13 <= local_d8) & (uint)fVar13 |
                          (uint)local_d8 & -(uint)(fVar13 <= local_d8));
          if ('\0' < column->SortOrder) {
            IVar9 = GetColorU32(0,0.7);
            PushStyleColor(0,IVar9);
            IVar4.y = local_e8;
            IVar4.x = (pIVar6->Style).ItemInnerSpacing.x + fVar16;
            RenderText(IVar4,sort_order_suf,(char *)0x0,true);
            PopStyleColor(1);
            fVar16 = fVar16 + fVar14;
          }
          draw_list = this->DrawList;
          IVar9 = GetColorU32(0,1.0);
          IVar5.y = local_e8;
          IVar5.x = fVar16;
          RenderArrow(draw_list,IVar5,IVar9,(column->field_0x64 & 3) == 1 ^ 3,0.65);
        }
        if ((bVar7) && ((int)local_f8 != table->ReorderColumn)) {
          sort_direction = TableGetColumnNextSortDirection(column);
          TableSetColumnSortDirection((int)local_f8,sort_direction,(pIVar6->IO).KeyShift);
        }
      }
      local_60.y = (float)local_58._0_4_ + local_e8 + (pIVar6->Style).FramePadding.y;
      local_60.x = fVar13;
      RenderTextEllipsis(this->DrawList,&label_pos,&local_60,fVar13,fVar13,text,text_end,&label_size
                        );
      if (((fVar13 - label_pos.x < label_size.x) && (hovered == true)) &&
         (pIVar6->TooltipSlowDelay <= pIVar6->HoveredIdNotActiveTimer &&
          pIVar6->HoveredIdNotActiveTimer != pIVar6->TooltipSlowDelay)) {
        SetTooltip("%.*s",(ulong)(uint)((int)text_end - (int)text));
      }
      bVar7 = IsMouseReleased(1);
      if ((bVar7) && (bVar7 = IsItemHovered(0), bVar7)) {
        TableOpenContextMenu((int)local_f8);
      }
    }
  }
  return;
}

Assistant:

void ImGui::TableHeader(const char* label)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && "Need to call TableHeader() after BeginTable()!");
    IM_ASSERT(table->CurrentColumn != -1);
    const int column_n = table->CurrentColumn;
    ImGuiTableColumn* column = &table->Columns[column_n];

    // Label
    if (label == NULL)
        label = "";
    const char* label_end = FindRenderedTextEnd(label);
    ImVec2 label_size = CalcTextSize(label, label_end, true);
    ImVec2 label_pos = window->DC.CursorPos;

    // If we already got a row height, there's use that.
    // FIXME-TABLE: Padding problem if the correct outer-padding CellBgRect strays off our ClipRect?
    ImRect cell_r = TableGetCellBgRect(table, column_n);
    float label_height = ImMax(label_size.y, table->RowMinHeight - table->CellPaddingY * 2.0f);

    // Calculate ideal size for sort order arrow
    float w_arrow = 0.0f;
    float w_sort_text = 0.0f;
    char sort_order_suf[4] = "";
    const float ARROW_SCALE = 0.65f;
    if ((table->Flags & ImGuiTableFlags_Sortable) && !(column->Flags & ImGuiTableColumnFlags_NoSort))
    {
        w_arrow = ImFloor(g.FontSize * ARROW_SCALE + g.Style.FramePadding.x);
        if (column->SortOrder > 0)
        {
            ImFormatString(sort_order_suf, IM_ARRAYSIZE(sort_order_suf), "%d", column->SortOrder + 1);
            w_sort_text = g.Style.ItemInnerSpacing.x + CalcTextSize(sort_order_suf).x;
        }
    }

    // We feed our unclipped width to the column without writing on CursorMaxPos, so that column is still considering for merging.
    float max_pos_x = label_pos.x + label_size.x + w_sort_text + w_arrow;
    column->ContentMaxXHeadersUsed = ImMax(column->ContentMaxXHeadersUsed, column->WorkMaxX);
    column->ContentMaxXHeadersIdeal = ImMax(column->ContentMaxXHeadersIdeal, max_pos_x);

    // Keep header highlighted when context menu is open.
    const bool selected = (table->IsContextPopupOpen && table->ContextPopupColumn == column_n && table->InstanceInteracted == table->InstanceCurrent);
    ImGuiID id = window->GetID(label);
    ImRect bb(cell_r.Min.x, cell_r.Min.y, cell_r.Max.x, ImMax(cell_r.Max.y, cell_r.Min.y + label_height + g.Style.CellPadding.y * 2.0f));
    ItemSize(ImVec2(0.0f, label_height)); // Don't declare unclipped width, it'll be fed ContentMaxPosHeadersIdeal
    if (!ItemAdd(bb, id))
        return;

    //GetForegroundDrawList()->AddRect(cell_r.Min, cell_r.Max, IM_COL32(255, 0, 0, 255)); // [DEBUG]
    //GetForegroundDrawList()->AddRect(bb.Min, bb.Max, IM_COL32(255, 0, 0, 255)); // [DEBUG]

    // Using AllowItemOverlap mode because we cover the whole cell, and we want user to be able to submit subsequent items.
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_AllowItemOverlap);
    if (g.ActiveId != id)
        SetItemAllowOverlap();
    if (held || hovered || selected)
    {
        const ImU32 col = GetColorU32(held ? ImGuiCol_HeaderActive : hovered ? ImGuiCol_HeaderHovered : ImGuiCol_Header);
        //RenderFrame(bb.Min, bb.Max, col, false, 0.0f);
        TableSetBgColor(ImGuiTableBgTarget_CellBg, col, table->CurrentColumn);
        RenderNavHighlight(bb, id, ImGuiNavHighlightFlags_TypeThin | ImGuiNavHighlightFlags_NoRounding);
    }
    else
    {
        // Submit single cell bg color in the case we didn't submit a full header row
        if ((table->RowFlags & ImGuiTableRowFlags_Headers) == 0)
            TableSetBgColor(ImGuiTableBgTarget_CellBg, GetColorU32(ImGuiCol_TableHeaderBg), table->CurrentColumn);
    }
    if (held)
        table->HeldHeaderColumn = (ImGuiTableColumnIdx)column_n;
    window->DC.CursorPos.y -= g.Style.ItemSpacing.y * 0.5f;

    // Drag and drop to re-order columns.
    // FIXME-TABLE: Scroll request while reordering a column and it lands out of the scrolling zone.
    if (held && (table->Flags & ImGuiTableFlags_Reorderable) && IsMouseDragging(0) && !g.DragDropActive)
    {
        // While moving a column it will jump on the other side of the mouse, so we also test for MouseDelta.x
        table->ReorderColumn = (ImGuiTableColumnIdx)column_n;
        table->InstanceInteracted = table->InstanceCurrent;

        // We don't reorder: through the frozen<>unfrozen line, or through a column that is marked with ImGuiTableColumnFlags_NoReorder.
        if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < cell_r.Min.x)
            if (ImGuiTableColumn* prev_column = (column->PrevEnabledColumn != -1) ? &table->Columns[column->PrevEnabledColumn] : NULL)
                if (!((column->Flags | prev_column->Flags) & ImGuiTableColumnFlags_NoReorder))
                    if ((column->IndexWithinEnabledSet < table->FreezeColumnsRequest) == (prev_column->IndexWithinEnabledSet < table->FreezeColumnsRequest))
                        table->ReorderColumnDir = -1;
        if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > cell_r.Max.x)
            if (ImGuiTableColumn* next_column = (column->NextEnabledColumn != -1) ? &table->Columns[column->NextEnabledColumn] : NULL)
                if (!((column->Flags | next_column->Flags) & ImGuiTableColumnFlags_NoReorder))
                    if ((column->IndexWithinEnabledSet < table->FreezeColumnsRequest) == (next_column->IndexWithinEnabledSet < table->FreezeColumnsRequest))
                        table->ReorderColumnDir = +1;
    }

    // Sort order arrow
    const float ellipsis_max = cell_r.Max.x - w_arrow - w_sort_text;
    if ((table->Flags & ImGuiTableFlags_Sortable) && !(column->Flags & ImGuiTableColumnFlags_NoSort))
    {
        if (column->SortOrder != -1)
        {
            float x = ImMax(cell_r.Min.x, cell_r.Max.x - w_arrow - w_sort_text);
            float y = label_pos.y;
            if (column->SortOrder > 0)
            {
                PushStyleColor(ImGuiCol_Text, GetColorU32(ImGuiCol_Text, 0.70f));
                RenderText(ImVec2(x + g.Style.ItemInnerSpacing.x, y), sort_order_suf);
                PopStyleColor();
                x += w_sort_text;
            }
            RenderArrow(window->DrawList, ImVec2(x, y), GetColorU32(ImGuiCol_Text), column->SortDirection == ImGuiSortDirection_Ascending ? ImGuiDir_Up : ImGuiDir_Down, ARROW_SCALE);
        }

        // Handle clicking on column header to adjust Sort Order
        if (pressed && table->ReorderColumn != column_n)
        {
            ImGuiSortDirection sort_direction = TableGetColumnNextSortDirection(column);
            TableSetColumnSortDirection(column_n, sort_direction, g.IO.KeyShift);
        }
    }

    // Render clipped label. Clipping here ensure that in the majority of situations, all our header cells will
    // be merged into a single draw call.
    //window->DrawList->AddCircleFilled(ImVec2(ellipsis_max, label_pos.y), 40, IM_COL32_WHITE);
    RenderTextEllipsis(window->DrawList, label_pos, ImVec2(ellipsis_max, label_pos.y + label_height + g.Style.FramePadding.y), ellipsis_max, ellipsis_max, label, label_end, &label_size);

    const bool text_clipped = label_size.x > (ellipsis_max - label_pos.x);
    if (text_clipped && hovered && g.HoveredIdNotActiveTimer > g.TooltipSlowDelay)
        SetTooltip("%.*s", (int)(label_end - label), label);

    // We don't use BeginPopupContextItem() because we want the popup to stay up even after the column is hidden
    if (IsMouseReleased(1) && IsItemHovered())
        TableOpenContextMenu(column_n);
}